

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O1

OpCode __thiscall Js::ByteCodeReader::ReadOp(ByteCodeReader *this,byte **ip,LayoutSize *layoutSize)

{
  byte bVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  undefined4 *puVar6;
  
  if (this->m_endLocation <= *ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x4f,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pbVar2 = *ip;
  *ip = pbVar2 + 1;
  bVar1 = *pbVar2;
  bVar4 = OpCodeUtil::IsPrefixOpcode((ushort)bVar1);
  if (bVar4) {
    OVar5 = ReadPrefixedOp(this,ip,layoutSize,(ushort)bVar1);
    return OVar5;
  }
  *layoutSize = SmallLayout;
  return (OpCode)bVar1;
}

Assistant:

OpCode ByteCodeReader::ReadOp(const byte *&ip, LayoutSize& layoutSize) const
    {
        // Return current location and advance past data.

        Assert(ip < m_endLocation);
        OpCode op = (OpCode)*ip++;

        if (!OpCodeUtil::IsPrefixOpcode(op))
        {
            layoutSize = SmallLayout;
            return op;
        }

        return ReadPrefixedOp(ip, layoutSize, op);
    }